

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_main.c
# Opt level: O2

int main(int argc,char **argv)

{
  cmd_entry_t *pcVar1;
  int iVar2;
  err_t code;
  char *pcVar3;
  cmd_entry_t *pcVar4;
  ulong uVar5;
  
  if ((((1 < argc) && (iVar2 = strCmp(argv[1],"stamp"), iVar2 == 0)) ||
      (code = cmdStDo(0x2000001), code == 0)) && (code = cmdInit(), code == 0)) {
    if (argc < 2) {
      cmdUsage();
      return -1;
    }
    uVar5 = 0xffffffffffffffff;
    pcVar1 = _cmds;
    while (pcVar4 = pcVar1, uVar5 = uVar5 + 1, uVar5 < _count) {
      iVar2 = strCmp(argv[1],pcVar4->name);
      pcVar1 = pcVar4 + 1;
      if (iVar2 == 0) {
        iVar2 = (*pcVar4->fn)(argc + -1,argv + 1);
        return iVar2;
      }
    }
    code = 0x259;
  }
  pcVar3 = errMsg(code);
  printf("bee2cmd: %s\n",pcVar3);
  return -1;
}

Assistant:

int main(int argc, char* argv[])
{
	err_t code;
	size_t pos;
	// проверка штампа
	if ((argc < 2 || !strEq(argv[1], "stamp")) &&
		(code = cmdStDo(CMD_ST_BASH | CMD_ST_STAMP)) != ERR_OK)
	{
		printf("bee2cmd: %s\n", errMsg(code));
		return -1;
	}
	// старт
	code = cmdInit();
	if (code != ERR_OK)
	{
		printf("bee2cmd: %s\n", errMsg(code));
		return -1;
	}
	// справка
	if (argc < 2)
		return cmdUsage();
	// обработка команды
	for (pos = 0; pos < _count; ++pos)
		if (strEq(argv[1], _cmds[pos].name))
			return _cmds[pos].fn(argc - 1,  argv + 1);
	printf("bee2cmd: %s\n", errMsg(ERR_CMD_NOT_FOUND));
	return -1;
}